

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

ActionResult * __thiscall
spectest::CommandRunner::RunAction
          (ActionResult *__return_storage_ptr__,CommandRunner *this,int line_number,Action *action,
          RunVerbosity verbose)

{
  bool bVar1;
  ulong uVar2;
  mapped_type *other;
  undefined8 uVar3;
  undefined8 uVar4;
  FuncType *pFVar5;
  pointer this_00;
  Extern *pEVar6;
  GlobalType *pGVar7;
  string_view name;
  Ptr *in_stack_ffffffffffffff20;
  ExportMap *local_b0;
  Value local_90;
  Global *local_80;
  Global *global;
  char *local_70;
  Enum local_64;
  Func *local_60;
  Func *func;
  undefined1 local_50 [8];
  Ptr extern_;
  ExportMap *module;
  RunVerbosity verbose_local;
  Action *action_local;
  int line_number_local;
  CommandRunner *this_local;
  ActionResult *result;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_b0 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>_>_>_>
               ::operator[](&this->instances_,&action->module_name);
  }
  else {
    local_b0 = &this->last_instance_;
  }
  extern_.root_index_ = (Index)local_b0;
  other = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
          ::operator[](local_b0,&action->field_name);
  wabt::interp::RefPtr<wabt::interp::Extern>::RefPtr((RefPtr<wabt::interp::Extern> *)local_50,other)
  ;
  bVar1 = wabt::interp::RefPtr::operator_cast_to_bool((RefPtr *)local_50);
  if (bVar1) {
    func._3_1_ = 0;
    ActionResult::ActionResult(__return_storage_ptr__);
    if (action->type == Invoke) {
      pEVar6 = wabt::interp::RefPtr<wabt::interp::Extern>::get
                         ((RefPtr<wabt::interp::Extern> *)local_50);
      local_60 = wabt::cast<wabt::interp::Func,wabt::interp::Extern>(pEVar6);
      local_64 = (Enum)wabt::interp::Func::Call
                                 (local_60,&this->store_,&action->args,
                                  &__return_storage_ptr__->values,&__return_storage_ptr__->trap,
                                  s_trace_stream);
      pFVar5 = wabt::interp::Func::type(local_60);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                (&__return_storage_ptr__->types,&pFVar5->results);
      if (verbose == Verbose) {
        this_00 = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                            (&s_stdout_stream);
        wabt::string_view::string_view((string_view *)&global,&action->field_name);
        pFVar5 = wabt::interp::Func::type(local_60);
        name.size_ = (size_type)pFVar5;
        name.data_ = local_70;
        wabt::interp::WriteCall
                  ((interp *)this_00,(Stream *)global,name,(FuncType *)&action->args,
                   &__return_storage_ptr__->values,(Values *)&__return_storage_ptr__->trap,
                   in_stack_ffffffffffffff20);
      }
    }
    else {
      if (action->type != Get) {
        abort();
      }
      pEVar6 = wabt::interp::RefPtr<wabt::interp::Extern>::get
                         ((RefPtr<wabt::interp::Extern> *)local_50);
      local_80 = wabt::cast<wabt::interp::Global,wabt::interp::Extern>(pEVar6);
      local_90 = wabt::interp::Global::Get(local_80);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::push_back
                (&__return_storage_ptr__->values,&local_90);
      pGVar7 = wabt::interp::Global::type(local_80);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
                (&__return_storage_ptr__->types,(value_type *)&(pGVar7->super_ExternType).field_0xc)
      ;
    }
    func._3_1_ = 1;
  }
  else {
    uVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::c_str();
    PrintError(this,line_number,"unknown invoke \"%s.%s\"",uVar3,uVar4);
    memset(__return_storage_ptr__,0,0x18);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&__return_storage_ptr__->types);
    memset(&__return_storage_ptr__->values,0,0x18);
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
              (&__return_storage_ptr__->values);
    wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr(&__return_storage_ptr__->trap);
  }
  func._4_4_ = 1;
  wabt::interp::RefPtr<wabt::interp::Extern>::~RefPtr((RefPtr<wabt::interp::Extern> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

ActionResult CommandRunner::RunAction(int line_number,
                                      const Action* action,
                                      RunVerbosity verbose) {
  ExportMap& module = !action->module_name.empty()
                          ? instances_[action->module_name]
                          : last_instance_;
  Extern::Ptr extern_ = module[action->field_name];
  if (!extern_) {
    PrintError(line_number, "unknown invoke \"%s.%s\"",
               action->module_name.c_str(), action->field_name.c_str());
    return {};
  }

  ActionResult result;

  switch (action->type) {
    case ActionType::Invoke: {
      auto* func = cast<interp::Func>(extern_.get());
      func->Call(store_, action->args, result.values, &result.trap,
                 s_trace_stream);
      result.types = func->type().results;
      if (verbose == RunVerbosity::Verbose) {
        WriteCall(s_stdout_stream.get(), action->field_name, func->type(),
                  action->args, result.values, result.trap);
      }
      break;
    }

    case ActionType::Get: {
      auto* global = cast<interp::Global>(extern_.get());
      result.values.push_back(global->Get());
      result.types.push_back(global->type().type);
      break;
    }

    default:
      WABT_UNREACHABLE;
  }

  return result;
}